

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestThread.cpp
# Opt level: O2

uint testThread::ThreadData::proc(void *args)

{
  code *pcVar1;
  int iVar2;
  bool bVar3;
  
  if (*args != 0x7b) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestThread.cpp"
                          ,0x10,"threadData.intParam == 123");
    if (iVar2 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  iVar2 = 10000;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    LOCK();
    *(int *)((long)args + 4) = *(int *)((long)args + 4) + 1;
    UNLOCK();
    Thread::yield();
  }
  return 0x2a;
}

Assistant:

static uint proc(void* args)
      {
        ThreadData& threadData = *(ThreadData*)args;

        ASSERT(threadData.intParam == 123);
        for (int i = 0; i < 10000; ++i)
        {
          Atomic::increment(threadData.counter);
          Thread::yield();
        }
        return 42;
      }